

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.cpp
# Opt level: O3

void update_disp(void)

{
  int iVar1;
  bool bVar2;
  int n;
  long lVar3;
  bool bVar4;
  long lVar5;
  missile *pmVar6;
  
  lVar3 = 0;
  do {
    n = (int)lVar3;
    if (robots[lVar3].status != 0) {
      plot_robot(n);
      robot_stat(n);
    }
    lVar5 = 0;
    bVar2 = true;
    do {
      bVar4 = bVar2;
      iVar1 = missiles[lVar3][lVar5].stat;
      if (iVar1 == 2) {
        pmVar6 = missiles[lVar3] + lVar5;
        plot_exp(n,(int)lVar5);
        if (pmVar6->count < 1) {
          pmVar6->stat = 0;
        }
        else {
          pmVar6->count = pmVar6->count + -1;
        }
      }
      else if (iVar1 == 1) {
        plot_miss(n,(int)lVar5);
      }
      lVar5 = 1;
      bVar2 = false;
    } while (bVar4);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  return;
}

Assistant:

void update_disp()
{
   int i, j;

  /* plot each live robot and update status */
  for (i = 0; i < MAXROBOTS; i++) {
    if (robots[i].status != DEAD) {
      plot_robot(i);
      robot_stat(i);
    }
    /* plot each missile */
    for (j = 0; j < MIS_ROBOT; j++) {
      switch (missiles[i][j].stat) {
	case AVAIL:
	  break;
	case FLYING:
	  plot_miss(i,j);
	  break;
	case EXPLODING:
	  plot_exp(i,j);
	  count_miss(i,j);
	  break;
	default:
	  break;
      }
    }
  }
}